

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriterTests.cpp
# Opt level: O0

bool anon_unknown.dwarf_bde1d::IsCorrectData<unsigned_char>
               (string *filePath,uint64_t offset,
               Span<const_unsigned_char,_18446744073709551615UL> expectedSpan)

{
  pointer *this;
  size_t sVar1;
  size_t sVar2;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  SpanSize<18446744073709551615UL> in_R8;
  Span<unsigned_char,_18446744073709551615UL> SVar3;
  bool local_f1;
  undefined1 auStack_a8 [8];
  Span<unsigned_char,_18446744073709551615UL> outputSpan;
  allocator<unsigned_char> local_81;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  blob_metadata metadata;
  uint64_t offset_local;
  string *filePath_local;
  Span<const_unsigned_char,_18446744073709551615UL> expectedSpan_local;
  
  expectedSpan_local.m_ptr = (pointer)expectedSpan.m_size.m_size;
  filePath_local = (string *)expectedSpan.m_ptr;
  this = &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  MILBlob::Blob::blob_metadata::blob_metadata((blob_metadata *)this);
  MILBlob::TestUtil::ReadData<MILBlob::Blob::blob_metadata>(filePath,(blob_metadata *)this,offset);
  sVar1 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                    ((Span<const_unsigned_char,_18446744073709551615UL> *)&filePath_local);
  std::allocator<unsigned_char>::allocator(&local_81);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,sVar1,&local_81);
  std::allocator<unsigned_char>::~allocator(&local_81);
  SVar3 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  outputSpan.m_ptr = (pointer)SVar3.m_size.m_size;
  auStack_a8 = (undefined1  [8])SVar3.m_ptr;
  SVar3.m_size.m_size = in_R8.m_size;
  SVar3.m_ptr = outputSpan.m_ptr;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)filePath,(string *)metadata.sizeInBytes,(uint64_t)auStack_a8,SVar3);
  sVar1 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::Size
                    ((Span<unsigned_char,_18446744073709551615UL> *)auStack_a8);
  sVar2 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                    ((Span<const_unsigned_char,_18446744073709551615UL> *)&filePath_local);
  local_f1 = false;
  if (sVar1 == sVar2) {
    __first1 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin
                         ((Span<unsigned_char,_18446744073709551615UL> *)auStack_a8);
    __last1 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                        ((Span<unsigned_char,_18446744073709551615UL> *)auStack_a8);
    __first2 = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                         ((Span<const_unsigned_char,_18446744073709551615UL> *)&filePath_local);
    local_f1 = std::equal<unsigned_char*,unsigned_char_const*>(__first1,__last1,__first2);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  return local_f1;
}

Assistant:

[[nodiscard]] bool IsCorrectData(const std::string& filePath, uint64_t offset, Util::Span<const T> expectedSpan)
{
    blob_metadata metadata;
    TestUtil::ReadData<blob_metadata>(filePath, metadata, offset);

    std::vector<T> output(expectedSpan.Size());
    auto outputSpan = Util::MakeSpan(output);
    TestUtil::ReadBlobFile<T>(filePath, metadata.offset, outputSpan);

    return outputSpan.Size() == expectedSpan.Size() &&
           std::equal(outputSpan.begin(), outputSpan.end(), expectedSpan.begin());
}